

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  U32 UVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  size_t *psVar5;
  void *ptr;
  uint uVar6;
  
  UVar1 = dt->baseValue;
  uVar6 = bitD->bitsConsumed + UVar1;
  bitD->bitsConsumed = uVar6;
  DStatePtr->state = ~(-1L << ((byte)UVar1 & 0x3f)) & bitD->bitContainer >> (-(char)uVar6 & 0x3fU);
  if (uVar6 < 0x41) {
    pcVar2 = bitD->ptr;
    if (pcVar2 < bitD->limitPtr) {
      pcVar3 = bitD->start;
      if (pcVar2 == pcVar3) goto LAB_001c23ec;
      uVar4 = (int)pcVar2 - (int)pcVar3;
      if (pcVar3 <= pcVar2 + -(ulong)(uVar6 >> 3)) {
        uVar4 = uVar6 >> 3;
      }
      psVar5 = (size_t *)(pcVar2 + -(ulong)uVar4);
      bitD->ptr = (char *)psVar5;
      uVar6 = uVar6 + uVar4 * -8;
    }
    else {
      psVar5 = (size_t *)(pcVar2 + -(ulong)(uVar6 >> 3));
      bitD->ptr = (char *)psVar5;
      uVar6 = uVar6 & 7;
    }
    bitD->bitsConsumed = uVar6;
    bitD->bitContainer = *psVar5;
  }
LAB_001c23ec:
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}